

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t find_last_nonempty_line(Terminal *term,tree234 *screen)

{
  _Bool _Var1;
  void *pvVar2;
  int local_2c;
  wchar_t j;
  termline *line;
  wchar_t i;
  tree234 *screen_local;
  Terminal *term_local;
  
  line._4_4_ = count234(screen);
  do {
    line._4_4_ = line._4_4_ + L'\xffffffff';
    if (line._4_4_ < L'\0') {
      return line._4_4_;
    }
    pvVar2 = index234(screen,line._4_4_);
    local_2c = 0;
    while ((local_2c < *(int *)((long)pvVar2 + 4) &&
           (_Var1 = termchars_equal((termchar *)
                                    (*(long *)((long)pvVar2 + 0x18) + (long)local_2c * 0x20),
                                    &term->erase_char), _Var1))) {
      local_2c = local_2c + 1;
    }
  } while (local_2c == *(int *)((long)pvVar2 + 4));
  return line._4_4_;
}

Assistant:

static int find_last_nonempty_line(Terminal * term, tree234 * screen)
{
    int i;
    for (i = count234(screen) - 1; i >= 0; i--) {
        termline *line = index234(screen, i);
        int j;
        for (j = 0; j < line->cols; j++)
            if (!termchars_equal(&line->chars[j], &term->erase_char))
                break;
        if (j != line->cols) break;
    }
    return i;
}